

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int sprint_dns_questions(char *dest,char *message_start)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  dns_header *header;
  question q;
  question local_11c;
  
  iVar2 = read_dns_question(&local_11c,message_start + 0xc,message_start);
  uVar1 = *(ushort *)(message_start + (long)iVar2 + 0xe);
  local_11c.qclass = uVar1 << 8 | uVar1 >> 8;
  local_11c.qtype =
       *(ushort *)(message_start + (long)iVar2 + 0xc) << 8 |
       *(ushort *)(message_start + (long)iVar2 + 0xc) >> 8;
  builtin_strncpy(dest,"-------QUESTIONS----------\n",0x1c);
  if (local_11c.qtype < 0xf) {
    if (local_11c.qtype == 1) {
      pcVar3 = "A";
      goto LAB_0010244a;
    }
    if (local_11c.qtype == 5) {
      pcVar3 = "CNAME";
      goto LAB_0010244a;
    }
  }
  else {
    if (local_11c.qtype == 0xf) {
      pcVar3 = "MX";
      goto LAB_0010244a;
    }
    if (local_11c.qtype == 0x1c) {
      pcVar3 = "AAAA";
      goto LAB_0010244a;
    }
  }
  pcVar3 = "Unknow";
LAB_0010244a:
  pcVar4 = "Unknow";
  if (uVar1 == 0x100) {
    pcVar4 = "IN";
  }
  iVar2 = sprintf(dest + 0x1b,"%s type:%s class:%s\n",&local_11c,pcVar3,pcVar4);
  return (iVar2 + (int)(dest + 0x1b)) - (int)dest;
}

Assistant:

int sprint_dns_questions(char *dest, char *message_start) {
  struct question q;
  char *dest_ = dest;
  read_dns_questions(&q, message_start);
  dest += sprintf(dest, "-------QUESTIONS----------\n");
  dest += sprintf(dest, "%s type:%s class:%s\n", q.label,
                  debugstr(DEBUG_PRINT_TYPE_type, q.qtype),
                  debugstr(DEBUG_PRINT_TYPE_class, q.qclass));
  return dest - dest_;
}